

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonutil.cpp
# Opt level: O1

vec2f json2vec2f(Json *o)

{
  vec2f vVar1;
  undefined8 *puVar2;
  vector<float,_std::allocator<float>_> a;
  float local_30;
  undefined4 uStack_2c;
  pointer local_28;
  pointer local_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  if ((byte)(o->m_type - number_integer) < 3) {
    nlohmann::detail::
    from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_float,_0>
              (o,&local_30);
    local_18._4_4_ = local_30;
  }
  else {
    if (o->m_type != array) {
      puVar2 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar2 = "failed convert json to vec2f";
      __cxa_throw(puVar2,&char_const*::typeinfo,0);
    }
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::get<std::vector<float,_std::allocator<float>_>,_std::vector<float,_std::allocator<float>_>,_0>
              ((vector<float,_std::allocator<float>_> *)&local_30,o);
    puVar2 = (undefined8 *)CONCAT44(uStack_2c,local_30);
    if ((long)local_28 - (long)puVar2 != 8) {
      puVar2 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar2 = "vector size mismatched";
      __cxa_throw(puVar2,&char_const*::typeinfo,0);
    }
    local_18 = *puVar2;
    uStack_10 = 0;
    operator_delete(puVar2,(long)local_20 - (long)puVar2);
    local_30 = (float)local_18;
  }
  vVar1.y = local_18._4_4_;
  vVar1.x = local_30;
  return vVar1;
}

Assistant:

vec2f json2vec2f(const Json& o) {
	if (is_number(o))
		return vec2f(o);
	if (o.type() != Json::value_t::array)
		throw "failed convert json to vec2f";
	std::vector<float> a = o;
	if (a.size()!=2) throw "vector size mismatched";
	return vec2f(a[0], a[1]);
}